

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O2

_Bool dns_get_inet_qtype(char *buf,size_t len,uint16_t *qtype)

{
  short sVar1;
  char *pcVar2;
  dns_header_t *hdr;
  
  if ((0xc < len) && (*(short *)(buf + 4) != 0)) {
    pcVar2 = _dns_skip_qname(buf + 0xc);
    sVar1 = *(short *)(pcVar2 + 2);
    if (sVar1 == 0x100) {
      *qtype = 1;
    }
    return sVar1 == 0x100;
  }
  return false;
}

Assistant:

bool dns_get_inet_qtype(const char * buf, size_t len, uint16_t * qtype)
{
    struct dns_header_t * hdr = (struct dns_header_t *)buf;
    const char * p = (const char *)hdr;

    if (len <= sizeof(*hdr) || ntohs(hdr->qdcount) == 0)
        return false;
    
    // skip header
    p += sizeof(*hdr);
    // skip QNAME
    p = _dns_skip_qname(p);
    // skip QTYPE
    if (*(uint16_t *)(p += sizeof(uint16_t)) == htons(CLASS_IN)) {
        * qtype = ntohs(*(uint16_t *)p);
        return true;
    }
    return false;
}